

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

subiter_type __thiscall
gnuplotio::IteratorRange<const_double_(*)[3],_double[3]>::deref_subiter
          (IteratorRange<const_double_(*)[3],_double[3]> *this)

{
  double (*padVar1) [3];
  runtime_error *this_00;
  subiter_type sVar2;
  
  padVar1 = this->it;
  if (padVar1 != this->end) {
    sVar2.end = padVar1[1];
    sVar2.it = *padVar1;
    return sVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"attepted to dereference past end of iterator");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool is_end() const { return it == end; }